

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection_segment.cpp
# Opt level: O1

idx_t __thiscall
duckdb::ColumnDataCollectionSegment::ReadVectorInternal
          (ColumnDataCollectionSegment *this,ChunkManagementState *state,
          VectorDataIndex vector_index,Vector *result)

{
  vector<duckdb::VectorMetaData,_true> *this_00;
  ushort uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  idx_t iVar2;
  reference pvVar3;
  ColumnDataAllocator *pCVar4;
  data_ptr_t pdVar5;
  data_ptr_t __src;
  unsigned_long *puVar6;
  idx_t new_size;
  ulong uVar7;
  VectorDataIndex __n;
  idx_t target_offset;
  ValidityMask current_validity;
  ValidityMask local_50;
  
  iVar2 = GetTypeIdSize((result->type).physical_type_);
  this_00 = &this->vector_data;
  pvVar3 = vector<duckdb::VectorMetaData,_true>::operator[](this_00,vector_index.index);
  pCVar4 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&this->allocator);
  pdVar5 = ColumnDataAllocator::GetDataPointer(pCVar4,state,pvVar3->block_id,pvVar3->offset);
  uVar1 = pvVar3->count;
  puVar6 = (unsigned_long *)(pdVar5 + iVar2 * 0x800);
  if (0x3f < uVar1) {
    uVar7 = 0;
    do {
      if (puVar6[uVar7] != 0xffffffffffffffff) goto LAB_002c28c8;
      uVar7 = uVar7 + 1;
    } while (uVar1 >> 6 != uVar7);
  }
  if (((uVar1 & 0x3f) == 0) ||
     ((-1L << ((byte)uVar1 & 0x3f) | puVar6[uVar1 >> 6]) == 0xffffffffffffffff)) {
    puVar6 = (unsigned_long *)0x0;
  }
LAB_002c28c8:
  if (((pvVar3->next_data).index == 0xffffffffffffffff) && (state->properties != DISALLOW_ZERO_COPY)
     ) {
    result->data = pdVar5;
    FlatVector::VerifyFlatVector(result);
    this_01 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar6;
    (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
    new_size = (idx_t)pvVar3->count;
  }
  else {
    new_size = 0;
    __n.index = vector_index.index;
    if (vector_index.index != 0xffffffffffffffff) {
      do {
        pvVar3 = vector<duckdb::VectorMetaData,_true>::operator[](this_00,__n.index);
        new_size = new_size + pvVar3->count;
        __n.index = (pvVar3->next_data).index;
      } while (__n.index != 0xffffffffffffffff);
    }
    Vector::Resize(result,0,new_size);
    pdVar5 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (vector_index.index != 0xffffffffffffffff) {
      target_offset = 0;
      do {
        pvVar3 = vector<duckdb::VectorMetaData,_true>::operator[](this_00,vector_index.index);
        pCVar4 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&this->allocator);
        __src = ColumnDataAllocator::GetDataPointer(pCVar4,state,pvVar3->block_id,pvVar3->offset);
        uVar1 = pvVar3->count;
        puVar6 = (unsigned_long *)(__src + iVar2 * 0x800);
        if (0x3f < uVar1) {
          uVar7 = 0;
          do {
            if (puVar6[uVar7] != 0xffffffffffffffff) goto LAB_002c29db;
            uVar7 = uVar7 + 1;
          } while (uVar1 >> 6 != uVar7);
        }
        if (((uVar1 & 0x3f) == 0) ||
           ((-1L << ((byte)uVar1 & 0x3f) | puVar6[uVar1 >> 6]) == 0xffffffffffffffff)) {
          puVar6 = (unsigned_long *)0x0;
        }
LAB_002c29db:
        if (iVar2 != 0) {
          switchD_00b1422a::default(pdVar5 + target_offset * iVar2,__src,uVar1 * iVar2);
        }
        local_50.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_50.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_50.super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
        local_50.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar6;
        ValidityMask::SliceInPlace(&result->validity,&local_50,target_offset,0,(ulong)pvVar3->count)
        ;
        uVar1 = pvVar3->count;
        vector_index.index = (pvVar3->next_data).index;
        if (local_50.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        target_offset = target_offset + uVar1;
      } while (vector_index.index != 0xffffffffffffffff);
    }
  }
  return new_size;
}

Assistant:

idx_t ColumnDataCollectionSegment::ReadVectorInternal(ChunkManagementState &state, VectorDataIndex vector_index,
                                                      Vector &result) {
	auto &vector_type = result.GetType();
	auto internal_type = vector_type.InternalType();
	auto type_size = GetTypeIdSize(internal_type);
	auto &vdata = GetVectorData(vector_index);

	auto base_ptr = allocator->GetDataPointer(state, vdata.block_id, vdata.offset);
	auto validity_data = GetValidityPointer(base_ptr, type_size, vdata.count);
	if (!vdata.next_data.IsValid() && state.properties != ColumnDataScanProperties::DISALLOW_ZERO_COPY) {
		// no next data, we can do a zero-copy read of this vector
		FlatVector::SetData(result, base_ptr);
		FlatVector::Validity(result).Initialize(validity_data, STANDARD_VECTOR_SIZE);
		return vdata.count;
	}

	// the data for this vector is spread over multiple vector data entries
	// we need to copy over the data for each of the vectors
	// first figure out how many rows we need to copy by looping over all of the child vector indexes
	idx_t vector_count = 0;
	auto next_index = vector_index;
	while (next_index.IsValid()) {
		auto &current_vdata = GetVectorData(next_index);
		vector_count += current_vdata.count;
		next_index = current_vdata.next_data;
	}
	// resize the result vector
	result.Resize(0, vector_count);
	next_index = vector_index;
	// now perform the copy of each of the vectors
	auto target_data = FlatVector::GetData(result);
	auto &target_validity = FlatVector::Validity(result);
	idx_t current_offset = 0;
	while (next_index.IsValid()) {
		auto &current_vdata = GetVectorData(next_index);
		base_ptr = allocator->GetDataPointer(state, current_vdata.block_id, current_vdata.offset);
		validity_data = GetValidityPointer(base_ptr, type_size, current_vdata.count);
		if (type_size > 0) {
			memcpy(target_data + current_offset * type_size, base_ptr, current_vdata.count * type_size);
		}
		ValidityMask current_validity(validity_data, STANDARD_VECTOR_SIZE);
		target_validity.SliceInPlace(current_validity, current_offset, 0, current_vdata.count);
		current_offset += current_vdata.count;
		next_index = current_vdata.next_data;
	}
	return vector_count;
}